

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O1

wchar_t archive_compressor_bzip2_open(archive_write_filter *f)

{
  int *piVar1;
  wchar_t wVar2;
  archive_string local_38;
  
  piVar1 = (int *)f->data;
  local_38.s = (char *)0x0;
  local_38.length = 0;
  local_38.buffer_length = 0;
  archive_strncat(&local_38,"bzip2",5);
  if (0 < *piVar1) {
    archive_strcat(&local_38," -");
    archive_strappend_char(&local_38,(char)*piVar1 + '0');
  }
  f->write = archive_compressor_bzip2_write;
  wVar2 = __archive_write_program_open(f,*(archive_write_program_data **)(piVar1 + 2),local_38.s);
  archive_string_free(&local_38);
  return wVar2;
}

Assistant:

static int
archive_compressor_bzip2_open(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;
	struct archive_string as;
	int r;

	archive_string_init(&as);
	archive_strcpy(&as, "bzip2");

	/* Specify compression level. */
	if (data->compression_level > 0) {
		archive_strcat(&as, " -");
		archive_strappend_char(&as, '0' + data->compression_level);
	}
	f->write = archive_compressor_bzip2_write;

	r = __archive_write_program_open(f, data->pdata, as.s);
	archive_string_free(&as);
	return (r);
}